

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O0

int absl::base_internal::GetNumCPUs(void)

{
  int iVar1;
  
  iVar1 = std::thread::hardware_concurrency();
  return iVar1;
}

Assistant:

static int GetNumCPUs() {
#if defined(__myriad2__)
  return 1;
#elif defined(_WIN32)
  const int hardware_concurrency = Win32NumCPUs();
  return hardware_concurrency ? hardware_concurrency : 1;
#elif defined(_AIX)
  return sysconf(_SC_NPROCESSORS_ONLN);
#else
  // Other possibilities:
  //  - Read /sys/devices/system/cpu/online and use cpumask_parse()
  //  - sysconf(_SC_NPROCESSORS_ONLN)
  return static_cast<int>(std::thread::hardware_concurrency());
#endif
}